

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O0

void __thiscall
t_php_generator::generate_deserialize_container
          (t_php_generator *this,ostream *out,t_type *ttype,string *prefix)

{
  t_type *ptVar1;
  uint uVar2;
  ostream *poVar3;
  string local_778;
  string local_758;
  string local_738;
  allocator local_711;
  string local_710;
  undefined1 local_6f0 [8];
  string i;
  string local_6b0;
  allocator local_689;
  string local_688;
  allocator local_661;
  string local_660;
  string local_640;
  string local_620;
  allocator local_5f9;
  string local_5f8;
  allocator local_5d1;
  string local_5d0;
  string local_5b0;
  allocator local_589;
  string local_588;
  allocator local_561;
  string local_560;
  allocator local_539;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  undefined1 local_478 [8];
  t_field fetype;
  undefined1 local_3a8 [8];
  t_field fvtype;
  undefined1 local_2d8 [8];
  t_field fktype;
  undefined1 local_208 [8];
  t_field fsize;
  string local_150;
  undefined1 local_130 [8];
  string etype;
  string local_108;
  undefined1 local_e8 [8];
  string vtype;
  string local_c0;
  undefined1 local_a0 [8];
  string ktype;
  allocator local_69;
  string local_68;
  undefined1 local_48 [8];
  string size;
  string *prefix_local;
  t_type *ttype_local;
  ostream *out_local;
  t_php_generator *this_local;
  
  size.field_2._8_8_ = prefix;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"_size",&local_69);
  t_generator::tmp((string *)local_48,(t_generator *)this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c0,"_ktype",(allocator *)(vtype.field_2._M_local_buf + 0xf));
  t_generator::tmp((string *)local_a0,(t_generator *)this,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)(vtype.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_108,"_vtype",(allocator *)(etype.field_2._M_local_buf + 0xf));
  t_generator::tmp((string *)local_e8,(t_generator *)this,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)(etype.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_150,"_etype",(allocator *)&fsize.field_0xaf);
  t_generator::tmp((string *)local_130,(t_generator *)this,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)&fsize.field_0xaf);
  ptVar1 = g_type_i32;
  std::__cxx11::string::string((string *)&fktype.reference_,(string *)local_48);
  t_field::t_field((t_field *)local_208,ptVar1,(string *)&fktype.reference_);
  std::__cxx11::string::~string((string *)&fktype.reference_);
  ptVar1 = g_type_i8;
  std::__cxx11::string::string((string *)&fvtype.reference_,(string *)local_a0);
  t_field::t_field((t_field *)local_2d8,ptVar1,(string *)&fvtype.reference_);
  std::__cxx11::string::~string((string *)&fvtype.reference_);
  ptVar1 = g_type_i8;
  std::__cxx11::string::string((string *)&fetype.reference_,(string *)local_e8);
  t_field::t_field((t_field *)local_3a8,ptVar1,(string *)&fetype.reference_);
  std::__cxx11::string::~string((string *)&fetype.reference_);
  ptVar1 = g_type_i8;
  std::__cxx11::string::string((string *)&local_498,(string *)local_130);
  t_field::t_field((t_field *)local_478,ptVar1,&local_498);
  std::__cxx11::string::~string((string *)&local_498);
  t_generator::indent_abi_cxx11_(&local_4b8,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_4b8);
  poVar3 = std::operator<<(poVar3,"$");
  poVar3 = std::operator<<(poVar3,(string *)prefix);
  poVar3 = std::operator<<(poVar3," = array();");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_4d8,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_4d8);
  poVar3 = std::operator<<(poVar3,"$");
  poVar3 = std::operator<<(poVar3,(string *)local_48);
  poVar3 = std::operator<<(poVar3," = 0;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::__cxx11::string::~string((string *)&local_4b8);
  uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])();
  if ((uVar2 & 1) == 0) {
    uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
    if ((uVar2 & 1) == 0) {
      uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
      if ((uVar2 & 1) != 0) {
        if ((this->binary_inline_ & 1U) == 0) {
          t_generator::indent_abi_cxx11_(&local_6b0,(t_generator *)this);
          poVar3 = std::operator<<(out,(string *)&local_6b0);
          poVar3 = std::operator<<(poVar3,"$");
          poVar3 = std::operator<<(poVar3,(string *)local_130);
          poVar3 = std::operator<<(poVar3," = 0;");
          poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
          t_generator::indent_abi_cxx11_((string *)((long)&i.field_2 + 8),(t_generator *)this);
          poVar3 = std::operator<<(poVar3,(string *)(i.field_2._M_local_buf + 8));
          poVar3 = std::operator<<(poVar3,"$xfer += $input->readListBegin(");
          poVar3 = std::operator<<(poVar3,"$");
          poVar3 = std::operator<<(poVar3,(string *)local_130);
          poVar3 = std::operator<<(poVar3,", $");
          poVar3 = std::operator<<(poVar3,(string *)local_48);
          poVar3 = std::operator<<(poVar3,");");
          std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)(i.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)&local_6b0);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_660,"",&local_661);
          generate_deserialize_field(this,out,(t_field *)local_478,&local_660,false);
          std::__cxx11::string::~string((string *)&local_660);
          std::allocator<char>::~allocator((allocator<char> *)&local_661);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_688,"",&local_689);
          generate_deserialize_field(this,out,(t_field *)local_208,&local_688,false);
          std::__cxx11::string::~string((string *)&local_688);
          std::allocator<char>::~allocator((allocator<char> *)&local_689);
        }
      }
    }
    else if ((this->binary_inline_ & 1U) == 0) {
      t_generator::indent_abi_cxx11_(&local_620,(t_generator *)this);
      poVar3 = std::operator<<(out,(string *)&local_620);
      poVar3 = std::operator<<(poVar3,"$");
      poVar3 = std::operator<<(poVar3,(string *)local_130);
      poVar3 = std::operator<<(poVar3," = 0;");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_640,(t_generator *)this);
      poVar3 = std::operator<<(poVar3,(string *)&local_640);
      poVar3 = std::operator<<(poVar3,"$xfer += $input->readSetBegin(");
      poVar3 = std::operator<<(poVar3,"$");
      poVar3 = std::operator<<(poVar3,(string *)local_130);
      poVar3 = std::operator<<(poVar3,", $");
      poVar3 = std::operator<<(poVar3,(string *)local_48);
      poVar3 = std::operator<<(poVar3,");");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_640);
      std::__cxx11::string::~string((string *)&local_620);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_5d0,"",&local_5d1);
      generate_deserialize_field(this,out,(t_field *)local_478,&local_5d0,false);
      std::__cxx11::string::~string((string *)&local_5d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_5f8,"",&local_5f9);
      generate_deserialize_field(this,out,(t_field *)local_208,&local_5f8,false);
      std::__cxx11::string::~string((string *)&local_5f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
    }
  }
  else {
    t_generator::indent_abi_cxx11_(&local_4f8,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_4f8);
    poVar3 = std::operator<<(poVar3,"$");
    poVar3 = std::operator<<(poVar3,(string *)local_a0);
    poVar3 = std::operator<<(poVar3," = 0;");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_518,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_518);
    poVar3 = std::operator<<(poVar3,"$");
    poVar3 = std::operator<<(poVar3,(string *)local_e8);
    poVar3 = std::operator<<(poVar3," = 0;");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_518);
    std::__cxx11::string::~string((string *)&local_4f8);
    if ((this->binary_inline_ & 1U) == 0) {
      t_generator::indent_abi_cxx11_(&local_5b0,(t_generator *)this);
      poVar3 = std::operator<<(out,(string *)&local_5b0);
      poVar3 = std::operator<<(poVar3,"$xfer += $input->readMapBegin(");
      poVar3 = std::operator<<(poVar3,"$");
      poVar3 = std::operator<<(poVar3,(string *)local_a0);
      poVar3 = std::operator<<(poVar3,", $");
      poVar3 = std::operator<<(poVar3,(string *)local_e8);
      poVar3 = std::operator<<(poVar3,", $");
      poVar3 = std::operator<<(poVar3,(string *)local_48);
      poVar3 = std::operator<<(poVar3,");");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_5b0);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_538,"",&local_539);
      generate_deserialize_field(this,out,(t_field *)local_2d8,&local_538,false);
      std::__cxx11::string::~string((string *)&local_538);
      std::allocator<char>::~allocator((allocator<char> *)&local_539);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_560,"",&local_561);
      generate_deserialize_field(this,out,(t_field *)local_3a8,&local_560,false);
      std::__cxx11::string::~string((string *)&local_560);
      std::allocator<char>::~allocator((allocator<char> *)&local_561);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_588,"",&local_589);
      generate_deserialize_field(this,out,(t_field *)local_208,&local_588,false);
      std::__cxx11::string::~string((string *)&local_588);
      std::allocator<char>::~allocator((allocator<char> *)&local_589);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_710,"_i",&local_711);
  t_generator::tmp((string *)local_6f0,(t_generator *)this,&local_710);
  std::__cxx11::string::~string((string *)&local_710);
  std::allocator<char>::~allocator((allocator<char> *)&local_711);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"for ($");
  poVar3 = std::operator<<(poVar3,(string *)local_6f0);
  poVar3 = std::operator<<(poVar3," = 0; $");
  poVar3 = std::operator<<(poVar3,(string *)local_6f0);
  poVar3 = std::operator<<(poVar3," < $");
  poVar3 = std::operator<<(poVar3,(string *)local_48);
  poVar3 = std::operator<<(poVar3,"; ++$");
  poVar3 = std::operator<<(poVar3,(string *)local_6f0);
  poVar3 = std::operator<<(poVar3,") {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])();
  if ((uVar2 & 1) == 0) {
    uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
    if ((uVar2 & 1) == 0) {
      uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
      if ((uVar2 & 1) != 0) {
        std::__cxx11::string::string((string *)&local_778,(string *)prefix);
        generate_deserialize_list_element(this,out,(t_list *)ttype,&local_778);
        std::__cxx11::string::~string((string *)&local_778);
      }
    }
    else {
      std::__cxx11::string::string((string *)&local_758,(string *)prefix);
      generate_deserialize_set_element(this,out,(t_set *)ttype,&local_758);
      std::__cxx11::string::~string((string *)&local_758);
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_738,(string *)prefix);
    generate_deserialize_map_element(this,out,(t_map *)ttype,&local_738);
    std::__cxx11::string::~string((string *)&local_738);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  if ((this->binary_inline_ & 1U) == 0) {
    uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])();
    if ((uVar2 & 1) == 0) {
      uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
      if ((uVar2 & 1) == 0) {
        uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
        if ((uVar2 & 1) != 0) {
          poVar3 = t_generator::indent((t_generator *)this,out);
          poVar3 = std::operator<<(poVar3,"$xfer += $input->readListEnd();");
          std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        }
      }
      else {
        poVar3 = t_generator::indent((t_generator *)this,out);
        poVar3 = std::operator<<(poVar3,"$xfer += $input->readSetEnd();");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      }
    }
    else {
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"$xfer += $input->readMapEnd();");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    }
  }
  std::__cxx11::string::~string((string *)local_6f0);
  t_field::~t_field((t_field *)local_478);
  t_field::~t_field((t_field *)local_3a8);
  t_field::~t_field((t_field *)local_2d8);
  t_field::~t_field((t_field *)local_208);
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void t_php_generator::generate_deserialize_container(ostream& out, t_type* ttype, string prefix) {
  string size = tmp("_size");
  string ktype = tmp("_ktype");
  string vtype = tmp("_vtype");
  string etype = tmp("_etype");

  t_field fsize(g_type_i32, size);
  t_field fktype(g_type_i8, ktype);
  t_field fvtype(g_type_i8, vtype);
  t_field fetype(g_type_i8, etype);

  out << indent() << "$" << prefix << " = array();" << endl << indent() << "$" << size << " = 0;"
      << endl;

  // Declare variables, read header
  if (ttype->is_map()) {
    out << indent() << "$" << ktype << " = 0;" << endl << indent() << "$" << vtype << " = 0;"
        << endl;
    if (binary_inline_) {
      generate_deserialize_field(out, &fktype);
      generate_deserialize_field(out, &fvtype);
      generate_deserialize_field(out, &fsize);
    } else {
      out << indent() << "$xfer += $input->readMapBegin("
          << "$" << ktype << ", $" << vtype << ", $" << size << ");" << endl;
    }
  } else if (ttype->is_set()) {
    if (binary_inline_) {
      generate_deserialize_field(out, &fetype);
      generate_deserialize_field(out, &fsize);
    } else {
      out << indent() << "$" << etype << " = 0;" << endl << indent()
          << "$xfer += $input->readSetBegin("
          << "$" << etype << ", $" << size << ");" << endl;
    }
  } else if (ttype->is_list()) {
    if (binary_inline_) {
      generate_deserialize_field(out, &fetype);
      generate_deserialize_field(out, &fsize);
    } else {
      out << indent() << "$" << etype << " = 0;" << endl << indent()
          << "$xfer += $input->readListBegin("
          << "$" << etype << ", $" << size << ");" << endl;
    }
  }

  // For loop iterates over elements
  string i = tmp("_i");
  indent(out) << "for ($" << i << " = 0; $" << i << " < $" << size << "; ++$" << i << ") {" << endl;

  indent_up();

  if (ttype->is_map()) {
    generate_deserialize_map_element(out, (t_map*)ttype, prefix);
  } else if (ttype->is_set()) {
    generate_deserialize_set_element(out, (t_set*)ttype, prefix);
  } else if (ttype->is_list()) {
    generate_deserialize_list_element(out, (t_list*)ttype, prefix);
  }

  scope_down(out);

  if (!binary_inline_) {
    // Read container end
    if (ttype->is_map()) {
      indent(out) << "$xfer += $input->readMapEnd();" << endl;
    } else if (ttype->is_set()) {
      indent(out) << "$xfer += $input->readSetEnd();" << endl;
    } else if (ttype->is_list()) {
      indent(out) << "$xfer += $input->readListEnd();" << endl;
    }
  }
}